

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

void __thiscall cmState::AddUnexpectedCommand(cmState *this,string *name,char *error)

{
  pointer pcVar1;
  string *psVar2;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  long *local_50;
  long local_48;
  long local_40 [2];
  char *local_30;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_30 = error;
  psVar2 = (string *)operator_new(0x28);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar2,local_50,local_48 + (long)local_50);
  *(char **)(psVar2 + 0x20) = local_30;
  pcStack_60 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmState.cxx:488:5)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmState.cxx:488:5)>
             ::_M_manager;
  local_78._M_unused._0_8_ = (undefined8)psVar2;
  AddBuiltinCommand(this,name,(Command *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void cmState::AddUnexpectedCommand(std::string const& name, const char* error)
{
  this->AddBuiltinCommand(
    name,
    [name, error](std::vector<cmListFileArgument> const&,
                  cmExecutionStatus& status) -> bool {
      cmValue versionValue =
        status.GetMakefile().GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION");
      if (name == "endif" &&
          (!versionValue || atof(versionValue->c_str()) <= 1.4)) {
        return true;
      }
      status.SetError(error);
      return false;
    });
}